

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

int * Extra_GreyCodeSchedule(int n)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar4 = 1 << ((byte)n & 0x1f);
  piVar1 = (int *)malloc((long)iVar4 << 2);
  iVar2 = 0;
  iVar3 = 0;
  if (0 < n) {
    iVar3 = n;
  }
  iVar5 = 0;
  for (; iVar2 != iVar3; iVar2 = iVar2 + 1) {
    piVar1[iVar5] = iVar2;
    for (lVar6 = 1; lVar6 < 1 << ((byte)iVar2 & 0x1f); lVar6 = lVar6 + 1) {
      piVar1[iVar5 + lVar6] = piVar1[lVar6 + -1];
    }
    iVar5 = iVar5 + (int)lVar6;
  }
  piVar1[iVar5] = n + -1;
  if (iVar5 + 1 == iVar4) {
    return piVar1;
  }
  __assert_fail("b == (1<<n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/extra/extraUtilMisc.c"
                ,0x882,"int *Extra_GreyCodeSchedule(int)");
}

Assistant:

int * Extra_GreyCodeSchedule( int n )
{
    int * pRes = ABC_ALLOC( int, (1<<n) );
    int i, k, b = 0;
//    pRes[b++] = -1;
    for ( k = 0; k < n; k++ )
        for ( pRes[b++] = k, i = 1; i < (1<<k); i++ )
            pRes[b++] = pRes[i-1]; // pRes[i];
    pRes[b++] = n-1;
    assert( b == (1<<n) );

    if ( 0 )
    {
        unsigned uSign = 0;
        for ( b = 0; b < (1<<n); b++ )
        {
            uSign ^= (1 << pRes[b]);
            printf( "%3d %3d  ", b, pRes[b] );
            Extra_PrintBinary( stdout, &uSign, n );
            printf( "\n" );
        }
    }
    return pRes;
}